

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildSimd_3
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,IRType dstSimdType,IRType srcSimdType)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  OpCode opcode;
  RegOpnd *this_00;
  RegOpnd *this_01;
  RegOpnd *this_02;
  undefined4 *puVar4;
  Instr *instr;
  IRBuilderAsmJs *this_03;
  
  VVar3 = GetSimdValueTypeFromIRType(this,srcSimdType);
  this_00 = BuildSrcOpnd(this,src1RegSlot,srcSimdType);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar3);
  this_01 = BuildSrcOpnd(this,src2RegSlot,srcSimdType);
  IR::Opnd::SetValueType(&this_01->super_Opnd,VVar3);
  this_03 = this;
  this_02 = BuildDstOpnd(this,dstRegSlot,dstSimdType);
  VVar3 = GetSimdValueTypeFromIRType(this_03,dstSimdType);
  IR::Opnd::SetValueType(&this_02->super_Opnd,VVar3);
  opcode = GetSimdOpcode(this,newOpcode);
  if (opcode == EndOfBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x19e3,"((uint32)opcode)","Invalid backend SIMD opcode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  instr = IR::Instr::New(opcode,&this_02->super_Opnd,&this_00->super_Opnd,&this_01->super_Opnd,
                         this->m_func);
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildSimd_3(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot, Js::RegSlot src2RegSlot, IRType dstSimdType, IRType srcSimdType)
{
    ValueType valueType = GetSimdValueTypeFromIRType(srcSimdType);
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, srcSimdType);
    src1Opnd->SetValueType(valueType);

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, srcSimdType);
    src2Opnd->SetValueType(valueType);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, dstSimdType);
    dstOpnd->SetValueType(GetSimdValueTypeFromIRType(dstSimdType));

    Js::OpCode opcode;

    opcode = GetSimdOpcode(newOpcode);

    AssertMsg((uint32)opcode, "Invalid backend SIMD opcode");

    IR::Instr * instr = IR::Instr::New(opcode, dstOpnd, src1Opnd, src2Opnd, m_func);
    AddInstr(instr, offset);
}